

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

void __thiscall SharedDirectory::delete_file(SharedDirectory *this,string *name)

{
  bool bVar1;
  Error *pEVar2;
  uintmax_t uVar3;
  iterator __position;
  uint64_t size;
  undefined1 local_48 [8];
  path p;
  string *name_local;
  SharedDirectory *this_local;
  
  bVar1 = can_read_file(this,name);
  if (!bVar1) {
    pEVar2 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar2,"The file is not deletable");
    __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
  }
  std::__cxx11::string::string((string *)&size,(string *)name);
  path_in_dir((path *)local_48,this,(string *)&size);
  std::__cxx11::string::~string((string *)&size);
  bVar1 = boost::filesystem::exists((path *)local_48);
  if (!bVar1) {
    pEVar2 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar2,"The file does not exist");
    __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
  }
  uVar3 = boost::filesystem::file_size((path *)local_48);
  __position = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::find(&this->indexed_files,name);
  std::
  map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::erase_abi_cxx11_((map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)this,__position);
  this->remaining_space = this->remaining_space + uVar3;
  boost::filesystem::remove(local_48);
  boost::filesystem::path::~path((path *)local_48);
  return;
}

Assistant:

void SharedDirectory::delete_file(const std::string &name) {
  if (!can_read_file(name)) {
    throw Error("The file is not deletable");
  }
  path p = path_in_dir(name);
  if (!exists(p)) {
    throw Error("The file does not exist");
  }

  uint64_t size = file_size(p);
  indexed_files.erase(indexed_files.find(name));
  remaining_space += size;
  remove(p);
}